

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3Fts5MallocZero(int *pRc,sqlite3_int64 nByte)

{
  undefined8 local_20;
  void *pRet;
  sqlite3_int64 nByte_local;
  int *pRc_local;
  
  local_20 = (void *)0x0;
  if (*pRc == 0) {
    local_20 = sqlite3_malloc64(nByte);
    if (local_20 == (void *)0x0) {
      if (0 < nByte) {
        *pRc = 7;
      }
    }
    else {
      memset(local_20,0,nByte);
    }
  }
  return local_20;
}

Assistant:

static void *sqlite3Fts5MallocZero(int *pRc, sqlite3_int64 nByte){
  void *pRet = 0;
  if( *pRc==SQLITE_OK ){
    pRet = sqlite3_malloc64(nByte);
    if( pRet==0 ){
      if( nByte>0 ) *pRc = SQLITE_NOMEM;
    }else{
      memset(pRet, 0, (size_t)nByte);
    }
  }
  return pRet;
}